

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O2

void __thiscall
QSslServerPrivate::initializeHandshakeProcess(QSslServerPrivate *this,QSslSocket *socket)

{
  void **ppvVar1;
  void **ppvVar2;
  undefined4 *puVar3;
  Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *pDVar4;
  ulong uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  iterator iVar7;
  undefined8 in_stack_ffffffffffffff68;
  QObject local_68 [8];
  QSslSocket *local_60;
  Connection destroyed;
  Connection readyRead;
  shared_ptr<QTimer> local_48;
  long local_38;
  
  uVar6 = (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppvVar1 = *(void ***)&(this->super_QTcpServerPrivate).field_0x8;
  readyRead.d_ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)QIODevice::readyRead;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar3 = (undefined4 *)operator_new(0x18);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/ssl/qsslserver.cpp:334:48),_QtPrivate::List<>,_void>
       ::impl;
  *(QSslServerPrivate **)(puVar3 + 4) = this;
  QObject::connectImpl
            ((QObject *)&readyRead,(void **)socket,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar3,(int *)((ulong)uVar6 << 0x20),
             (QMetaObject *)0x0);
  destroyed.d_ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)QObject::destroyed;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar3 = (undefined4 *)operator_new(0x18);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/ssl/qsslserver.cpp:337:65),_QtPrivate::List<QObject_*>,_void>
       ::impl;
  *(QSslServerPrivate **)(puVar3 + 4) = this;
  QObject::connectImpl
            ((QObject *)&destroyed,(void **)socket,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  local_60 = socket;
  std::make_shared<QTimer>();
  iVar7 = QHash<unsigned_long_long,QSslServerPrivate::SocketData>::
          emplace<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
                    ((QHash<unsigned_long_long,QSslServerPrivate::SocketData> *)&this->socketData,
                     (unsigned_long_long *)&local_60,&readyRead,&destroyed,&local_48);
  pDVar4 = iVar7.i.d;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  uVar5 = iVar7.i.bucket >> 7;
  uVar6 = (uint)iVar7.i.bucket & 0x7f;
  QTimer::setSingleShot
            (SUB81(*(undefined8 *)
                    (pDVar4->spans[uVar5].entries[pDVar4->spans[uVar5].offsets[uVar6]].storage.data
                    + 0x18),0));
  ppvVar2 = *(void ***)
             (pDVar4->spans[uVar5].entries[pDVar4->spans[uVar5].offsets[uVar6]].storage.data + 0x18)
  ;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)QTimer::timeout;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/ssl/qsslserver.cpp:344:40),_QtPrivate::List<>,_void>
       ::impl;
  *(QSslServerPrivate **)(puVar3 + 4) = this;
  *(QSslSocket **)(puVar3 + 6) = socket;
  QObject::connectImpl
            (local_68,ppvVar2,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QTimer::setInterval((int)*(undefined8 *)
                            (pDVar4->spans[uVar5].entries[pDVar4->spans[uVar5].offsets[uVar6]].
                             storage.data + 0x18));
  QTimer::start();
  QMetaObject::Connection::~Connection(&destroyed);
  QMetaObject::Connection::~Connection(&readyRead);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslServerPrivate::initializeHandshakeProcess(QSslSocket *socket)
{
    Q_Q(QSslServer);
    QMetaObject::Connection readyRead = QObject::connect(
            socket, &QSslSocket::readyRead, q, [this]() { checkClientHelloAndContinue(); });

    QMetaObject::Connection destroyed =
            QObject::connect(socket, &QSslSocket::destroyed, q, [this](QObject *obj) {
                // This cast is not safe to use since the socket is inside the
                // QObject dtor, but we only use the pointer value!
                removeSocketData(quintptr(obj));
            });
    auto it = socketData.emplace(quintptr(socket), readyRead, destroyed, std::make_shared<QTimer>());
    it->timeoutTimer->setSingleShot(true);
    it->timeoutTimer->callOnTimeout(q, [this, socket]() { handleHandshakeTimedOut(socket); });
    it->timeoutTimer->setInterval(handshakeTimeout);
    it->timeoutTimer->start();
}